

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O1

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::selectBranch
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this,size_t n)

{
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  *__x;
  undefined8 *puVar1;
  _Elt_pointer pSVar2;
  value_type *__x_00;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  v;
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  local_60;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pSVar2 = (this->parsingStack).c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  if (pSVar2[-1].kind_ != sAlternative) {
    throwMismatch(sAlternative,pSVar2[-1].kind_);
  }
  __x = boost::
        any_cast<std::vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>>>const&>
                  (&pSVar2[-1].extra_);
  std::
  vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  ::vector(&local_60,__x);
  if (n < (ulong)((long)local_60.
                        super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_60.
                        super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::pop_back
              (&(this->parsingStack).c);
    __x_00 = ((local_60.
               super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[n].px)->
             super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (__x_00 != ((local_60.
                    super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[n].px)->
                  super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>)
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::push_back
                  (&(this->parsingStack).c,__x_00);
        __x_00 = __x_00 + 1;
      } while (__x_00 != ((local_60.
                           super__Vector_base<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[n].px)->
                         super__Vector_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
    ::~vector(&local_60);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Not that many branches","");
  std::runtime_error::runtime_error((runtime_error *)(puVar1 + 1),(string *)local_48);
  *puVar1 = 0x1cd6f0;
  puVar1[1] = 0x1cd720;
  __cxa_throw(puVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void selectBranch(size_t n) {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sAlternative, s.kind());
        std::vector<ProductionPtr> v =
        s.extra<std::vector<ProductionPtr> >();
        if (n >= v.size()) {
            throw Exception("Not that many branches");
        }
        parsingStack.pop();
        append(v[n]);
    }